

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  Extension *pEVar1;
  ExtensionSet *const_this;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar2;
  
  if (message == (MessageLite *)0x0) {
    pEVar1 = FindOrNull(this,number);
    if (pEVar1 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar1);
    return;
  }
  pVar2 = Insert(this,number);
  pEVar1 = pVar2.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated != false) goto LAB_00283b44;
    if (0xed < (byte)(pEVar1->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) != 10)
      goto LAB_00283b5c;
      if ((pEVar1->field_0xa & 4) != 0) {
        (**(code **)(**(long **)&(pEVar1->field_0).int32_t_value + 0x38))
                  (*(long **)&(pEVar1->field_0).int32_t_value,message,this->arena_);
        goto LAB_00283b29;
      }
      if ((this->arena_ == (Arena *)0x0) && ((long *)(pEVar1->field_0).int64_t_value != (long *)0x0)
         ) {
        (**(code **)(*(long *)(pEVar1->field_0).int64_t_value + 8))();
      }
      goto LAB_00283b15;
    }
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      UnsafeArenaSetAllocatedMessage((ExtensionSet *)&stack0xffffffffffffffc8);
LAB_00283b44:
      UnsafeArenaSetAllocatedMessage((ExtensionSet *)&stack0xffffffffffffffc8);
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) == 10) {
      pEVar1->is_repeated = false;
      pEVar1->field_0xa = (pEVar1->field_0xa & 0xfa) + 1;
LAB_00283b15:
      pEVar1->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
LAB_00283b29:
      pEVar1->field_0xa = pEVar1->field_0xa & 0xfd;
      return;
    }
    UnsafeArenaSetAllocatedMessage();
  }
  UnsafeArenaSetAllocatedMessage((ExtensionSet *)&stack0xffffffffffffffc8);
LAB_00283b5c:
  UnsafeArenaSetAllocatedMessage();
}

Assistant:

void ExtensionSet::UnsafeArenaSetAllocatedMessage(
    int number, FieldType type, const FieldDescriptor* descriptor,
    MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    extension->ptr.message_value = message;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->UnsafeArenaSetAllocatedMessage(message,
                                                                       arena_);
    } else {
      if (arena_ == nullptr) {
        delete extension->ptr.message_value;
      }
      extension->ptr.message_value = message;
    }
  }
  extension->is_cleared = false;
}